

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serialize.cpp
# Opt level: O2

void writeStringLength(uint64_t value,ostream *stream)

{
  ulong in_RAX;
  undefined7 uStack_28;
  uchar c;
  
  _uStack_28 = in_RAX;
  for (; 0x7f < value; value = value >> 7) {
    _uStack_28 = CONCAT17((char)value,uStack_28) | 0x8000000000000000;
    std::ostream::write((char *)stream,(long)&c);
  }
  _uStack_28 = CONCAT17((char)value,uStack_28);
  std::ostream::write((char *)stream,(long)&c);
  return;
}

Assistant:

void writeStringLength(uint64_t value, std::ostream & stream)
{
  /*
   *  Length bits are saved in an array of unsigned char
   *  shaped like this: 1xxxxxxx 1xxxxxxx 1xxxxxxx 0xxxxxxx
   *  Most significant bit means:
   *    - 1 for more bytes to come
   *    - 0 for the last byte
   *  (Strings with length <= 127 only have a 1 byte prefix)
   */
  unsigned char c;
  while (value > 127) {
    c = (value & 0x7F) | 128;
    stream.write(reinterpret_cast<char *>(&c), 1);
    value >>= 7;
  }
  c = value;
  stream.write(reinterpret_cast<char *>(&c), 1);
}